

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Continuation> *
wasm::WATParser::conttype<wasm::WATParser::ParseTypeDefsCtx>
          (MaybeResult<wasm::Continuation> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  Lexer *this;
  bool bVar1;
  string_view expected;
  undefined1 local_b8 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> x;
  string local_70 [32];
  undefined1 local_50 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> _val;
  
  this = &ctx->in;
  expected._M_str = "cont";
  expected._M_len = 4;
  bVar1 = Lexer::takeSExprStart(this,expected);
  if (bVar1) {
    typeidx<wasm::WATParser::ParseTypeDefsCtx>
              ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                *)local_b8,ctx);
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       *)local_50,
                      (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       *)local_b8);
    if (_val.val.
        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        ._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string(local_70,(string *)local_50);
      std::__detail::__variant::_Variant_storage<false,wasm::Continuation,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Continuation,wasm::None,wasm::Err> *)
                 __return_storage_ptr__,local_70);
      std::__cxx11::string::~string(local_70);
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           *)local_50);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           *)local_50);
      bVar1 = Lexer::takeRParen(this);
      if (bVar1) {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).
          super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err> = local_b8;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err> + 0x20) =
             '\0';
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   ((long)&x.val.
                           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                   + 0x20),"expected end of cont type",(allocator<char> *)local_70);
        Lexer::err((Err *)local_50,this,
                   (string *)
                   ((long)&x.val.
                           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                   + 0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::Continuation,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Continuation,wasm::None,wasm::Err> *)
                   __return_storage_ptr__,local_50);
        std::__cxx11::string::~string((string *)local_50);
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&x.val.
                           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                   + 0x20));
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         *)local_b8);
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::Continuation,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Continuation,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Continuation,_wasm::None,_wasm::Err> + 0x20) =
         '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::ContinuationT> conttype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("cont"sv)) {
    return {};
  }

  auto x = typeidx(ctx);
  CHECK_ERR(x);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of cont type");
  }

  return ctx.makeContType(*x);
}